

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.h
# Opt level: O0

void pybind11::detail::initimpl::
     construct<pybind11::class_<std::vector<NodeView,std::allocator<NodeView>>,std::unique_ptr<std::vector<NodeView,std::allocator<NodeView>>,std::default_delete<std::vector<NodeView,std::allocator<NodeView>>>>>>
               (value_and_holder *v_h,
               Cpp<pybind11::class_<std::vector<NodeView>,_std::unique_ptr<std::vector<NodeView>_>_>_>
               *ptr,bool need_alias)

{
  void **ppvVar1;
  void *in_RSI;
  value_and_holder *in_RDI;
  
  no_nullptr(in_RSI);
  ppvVar1 = value_and_holder::value_ptr<void>(in_RDI);
  *ppvVar1 = in_RSI;
  return;
}

Assistant:

void construct(value_and_holder &v_h, Cpp<Class> *ptr, bool need_alias) {
    no_nullptr(ptr);
    if (Class::has_alias && need_alias && !is_alias<Class>(ptr)) {
        // We're going to try to construct an alias by moving the cpp type.  Whether or not
        // that succeeds, we still need to destroy the original cpp pointer (either the
        // moved away leftover, if the alias construction works, or the value itself if we
        // throw an error), but we can't just call `delete ptr`: it might have a special
        // deleter, or might be shared_from_this.  So we construct a holder around it as if
        // it was a normal instance, then steal the holder away into a local variable; thus
        // the holder and destruction happens when we leave the C++ scope, and the holder
        // class gets to handle the destruction however it likes.
        v_h.value_ptr() = ptr;
        v_h.set_instance_registered(true); // To prevent init_instance from registering it
        v_h.type->init_instance(v_h.inst, nullptr); // Set up the holder
        Holder<Class> temp_holder(std::move(v_h.holder<Holder<Class>>())); // Steal the holder
        v_h.type->dealloc(v_h); // Destroys the moved-out holder remains, resets value ptr to null
        v_h.set_instance_registered(false);

        construct_alias_from_cpp<Class>(is_alias_constructible<Class>{}, v_h, std::move(*ptr));
    } else {
        // Otherwise the type isn't inherited, so we don't need an Alias
        v_h.value_ptr() = ptr;
    }
}